

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O2

bool jpge::compress_image_to_jpeg_file
               (char *pFilename,int width,int height,int num_channels,uint8 *pImage_data,
               params *comp_params)

{
  bool bVar1;
  int iVar2;
  cfile_stream *ctx;
  undefined1 uVar3;
  uint uVar4;
  long lVar5;
  cfile_stream dst_stream;
  jpeg_encoder dst_image;
  cfile_stream local_3500;
  jpeg_encoder local_34e8;
  
  local_3500.super_output_stream._vptr_output_stream = (_func_int **)&PTR__cfile_stream_001b6588;
  local_3500.m_pFile = (FILE *)0x0;
  local_3500.m_bStatus = false;
  iVar2 = cfile_stream::open(&local_3500,pFilename,height);
  if ((char)iVar2 == '\0') {
    uVar3 = 0;
  }
  else {
    local_34e8.m_params.m_quality = 0x55;
    local_34e8.m_params.m_subsampling = H2V2;
    local_34e8.m_params.m_no_chroma_discrim_flag = false;
    local_34e8.m_params.m_two_pass_flag = false;
    local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
    local_34e8.m_pass_num = '\0';
    local_34e8.m_all_stream_writes_succeeded = true;
    ctx = &local_3500;
    iVar2 = jpeg_encoder::init(&local_34e8,(EVP_PKEY_CTX *)ctx);
    uVar4 = 0;
    uVar3 = 0;
    if ((char)iVar2 != '\0') {
      if (height < 1) {
        height = 0;
      }
      do {
        iVar2 = (int)ctx;
        if (local_34e8.m_params.m_two_pass_flag + 1 <= uVar4) {
          crnlib::crnlib_free(local_34e8.m_mcu_lines[0]);
          local_34e8.m_mcu_lines[0] = (uint8 *)0x0;
          local_34e8.m_pass_num = '\0';
          local_34e8.m_all_stream_writes_succeeded = true;
          iVar2 = cfile_stream::close(&local_3500,iVar2);
          uVar3 = (undefined1)iVar2;
          break;
        }
        iVar2 = 0;
        lVar5 = (ulong)(uint)height + 1;
        while (lVar5 = lVar5 + -1, lVar5 != 0) {
          bVar1 = jpeg_encoder::process_scanline(&local_34e8,pImage_data + iVar2);
          iVar2 = iVar2 + num_channels * width;
          if (!bVar1) {
            uVar3 = 0;
            goto LAB_00124ed8;
          }
        }
        ctx = (cfile_stream *)0x0;
        bVar1 = jpeg_encoder::process_scanline(&local_34e8,(void *)0x0);
        uVar4 = uVar4 + 1;
        uVar3 = 0;
      } while (bVar1);
    }
LAB_00124ed8:
    jpeg_encoder::~jpeg_encoder(&local_34e8);
  }
  cfile_stream::~cfile_stream(&local_3500);
  return (bool)uVar3;
}

Assistant:

bool compress_image_to_jpeg_file(const char* pFilename, int width, int height, int num_channels, const uint8* pImage_data, const params& comp_params) {
  cfile_stream dst_stream;
  if (!dst_stream.open(pFilename))
    return false;

  jpge::jpeg_encoder dst_image;
  if (!dst_image.init(&dst_stream, width, height, num_channels, comp_params))
    return false;

  for (uint pass_index = 0; pass_index < dst_image.get_total_passes(); pass_index++) {
    for (int i = 0; i < height; i++) {
      const uint8* pBuf = pImage_data + i * width * num_channels;
      if (!dst_image.process_scanline(pBuf))
        return false;
    }
    if (!dst_image.process_scanline(NULL))
      return false;
  }

  dst_image.deinit();

  return dst_stream.close();
}